

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.h
# Opt level: O0

void __thiscall
slang::ast::CoverCrossBodySymbol::CoverCrossBodySymbol
          (CoverCrossBodySymbol *this,Compilation *compilation,SourceLocation loc)

{
  basic_string_view<char,_std::char_traits<char>_> name;
  Compilation *compilation_local;
  CoverCrossBodySymbol *this_local;
  SourceLocation loc_local;
  
  name = sv("",0);
  Symbol::Symbol(&this->super_Symbol,CoverCrossBody,name,loc);
  Scope::Scope(&this->super_Scope,compilation,&this->super_Symbol);
  this->crossQueueType = (Type *)0x0;
  return;
}

Assistant:

CoverCrossBodySymbol(Compilation& compilation, SourceLocation loc) :
        Symbol(SymbolKind::CoverCrossBody, ""sv, loc), Scope(compilation, this) {}